

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::set_htt_hmixTYP(PeleLM *this)

{
  bool bVar1;
  double *pdVar2;
  Box *pBVar3;
  reference pvVar4;
  Print *this_00;
  int __c;
  char *__s;
  long in_RDI;
  IntVect IVar5;
  unsigned_long is;
  Array4<double> *h_mix;
  MFIter mfi;
  BoxArray baf;
  AmrLevel *htf;
  MultiFab hmix;
  DistributionMapping *dm;
  BoxArray *ba;
  MultiFab *S;
  AmrLevel *ht;
  int lvl;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  int finest_level;
  BoxArray *in_stack_fffffffffffff878;
  PeleLM *in_stack_fffffffffffff880;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff888;
  AmrMesh *in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff898;
  MFInfo *in_stack_fffffffffffff8a0;
  FabArrayBase *in_stack_fffffffffffff8a8;
  Print *in_stack_fffffffffffff8b0;
  BoxArray *in_stack_fffffffffffff8b8;
  BoxArray *in_stack_fffffffffffff8c0;
  BoxArray *in_stack_fffffffffffff8c8;
  Box *in_stack_fffffffffffff8d0;
  Print *in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffffb9e;
  undefined1 in_stack_fffffffffffffb9f;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  MultiFab *in_stack_fffffffffffffba8;
  BoxArray *local_3b0;
  undefined1 local_3a8 [64];
  Box *local_368;
  undefined1 local_35c [100];
  MFIter local_2f8;
  int local_298 [3];
  undefined4 local_288;
  undefined4 uStack_284;
  int local_280;
  PeleLM *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  char local_1e0 [384];
  DistributionMapping *local_60;
  BoxArray *local_58;
  MultiFab *local_50;
  PeleLM *local_38;
  int local_2c;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_28;
  int local_c;
  
  local_c = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
  pdVar2 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff880,
                      (size_type)in_stack_fffffffffffff878);
  if ((*pdVar2 != typical_RhoH_value_default) || (NAN(*pdVar2) || NAN(typical_RhoH_value_default)))
  {
    pdVar2 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff880,
                        (size_type)in_stack_fffffffffffff878);
    htt_hmixTYP = *pdVar2;
    if (1 < NavierStokesBase::verbose) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff8b0,(ostream *)in_stack_fffffffffffff8a8);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff880,(char (*) [45])in_stack_fffffffffffff878);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff880,(double *)in_stack_fffffffffffff878);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878)
      ;
      amrex::Print::~Print(in_stack_fffffffffffff8f0);
    }
  }
  else {
    htt_hmixTYP = 0.0;
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x2b3815);
    for (local_2c = 0; local_2c <= local_c; local_2c = local_2c + 1) {
      local_38 = getLevel(in_stack_fffffffffffff880,(int)((ulong)in_stack_fffffffffffff878 >> 0x20))
      ;
      local_50 = amrex::AmrLevel::get_new_data
                           ((AmrLevel *)in_stack_fffffffffffff880,
                            (int)((ulong)in_stack_fffffffffffff878 >> 0x20));
      local_58 = amrex::AmrLevel::boxArray((AmrLevel *)local_38);
      local_60 = amrex::AmrLevel::DistributionMap((AmrLevel *)local_38);
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_208 = 0;
      uStack_200 = 0;
      local_1e8 = 0;
      amrex::MFInfo::MFInfo((MFInfo *)0x2b38fe);
      in_stack_fffffffffffff878 =
           (BoxArray *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff880);
      amrex::MultiFab::MultiFab
                ((MultiFab *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                 (DistributionMapping *)in_stack_fffffffffffff8b0,
                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
                 in_stack_fffffffffffff8a0,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff8d0
                );
      amrex::MFInfo::~MFInfo((MFInfo *)0x2b3955);
      amrex::MultiFab::Copy
                ((MultiFab *)in_stack_fffffffffffff8b0,(MultiFab *)in_stack_fffffffffffff8a8,
                 (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),(int)in_stack_fffffffffffff8a0,
                 (int)((ulong)in_stack_fffffffffffff898 >> 0x20),(int)in_stack_fffffffffffff898);
      amrex::MultiFab::Divide
                ((MultiFab *)in_stack_fffffffffffff8b0,(MultiFab *)in_stack_fffffffffffff8a8,
                 (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),(int)in_stack_fffffffffffff8a0,
                 (int)((ulong)in_stack_fffffffffffff898 >> 0x20),(int)in_stack_fffffffffffff898);
      if (local_2c != local_c) {
        local_210 = getLevel(in_stack_fffffffffffff880,
                             (int)((ulong)in_stack_fffffffffffff878 >> 0x20));
        amrex::AmrLevel::boxArray((AmrLevel *)local_210);
        amrex::BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
        IVar5 = amrex::AmrMesh::refRatio
                          (in_stack_fffffffffffff890,(int)((ulong)in_stack_fffffffffffff888 >> 0x20)
                          );
        local_298[2] = IVar5.vect[2];
        local_280 = local_298[2];
        local_298._0_8_ = IVar5.vect._0_8_;
        local_288 = local_298[0];
        uStack_284 = local_298[1];
        local_298 = IVar5.vect;
        amrex::BoxArray::coarsen(in_stack_fffffffffffff8c8,(IntVect *)in_stack_fffffffffffff8c0);
        amrex::TilingIfNotGPU();
        amrex::MFIter::MFIter
                  ((MFIter *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                   SUB81((ulong)in_stack_fffffffffffff8a0 >> 0x38,0));
        while (bVar1 = amrex::MFIter::isValid(&local_2f8), bVar1) {
          __s = local_1e0;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_fffffffffffff888,(MFIter *)in_stack_fffffffffffff880);
          local_35c._92_8_ = local_35c + 0x1c;
          amrex::MFIter::index(&local_2f8,__s,__c);
          in_stack_fffffffffffff8f0 = (Print *)local_35c;
          amrex::BoxArray::operator[]
                    ((BoxArray *)in_stack_fffffffffffff890,
                     (int)((ulong)in_stack_fffffffffffff888 >> 0x20));
          amrex::BoxArray::intersections
                    (in_stack_fffffffffffff8c0,(Box *)in_stack_fffffffffffff8b8,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)in_stack_fffffffffffff8b0);
          local_368 = (Box *)0x0;
          while (in_stack_fffffffffffff8d0 = local_368,
                pBVar3 = (Box *)std::
                                vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ::size(&local_28), in_stack_fffffffffffff8d0 < pBVar3) {
            pvVar4 = std::
                     vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ::operator[](&local_28,(size_type)local_368);
            in_stack_fffffffffffff8c8 = (BoxArray *)&pvVar4->second;
            memcpy(local_3a8,(void *)local_35c._92_8_,0x3c);
            amrex::ParallelFor<PeleLM::set_htt_hmixTYP()::__0>
                      (in_stack_fffffffffffff8d0,
                       (anon_class_64_1_a8005125 *)in_stack_fffffffffffff8c8);
            local_368 = (Box *)((long)(local_368->smallend).vect + 1);
          }
          amrex::MFIter::operator++(&local_2f8);
        }
        amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff880);
        amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff880);
      }
      in_stack_fffffffffffff8c0 =
           (BoxArray *)
           amrex::MultiFab::norm0
                     (in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                      (bool)in_stack_fffffffffffffb9f,(bool)in_stack_fffffffffffffb9e);
      local_3b0 = in_stack_fffffffffffff8c0;
      in_stack_fffffffffffff8b8 = (BoxArray *)std::max<double>(&htt_hmixTYP,(double *)&local_3b0);
      htt_hmixTYP = *(Real *)&in_stack_fffffffffffff8b8->m_bat;
      amrex::MultiFab::~MultiFab((MultiFab *)0x2b3cf9);
    }
    amrex::ParallelDescriptor::ReduceRealMax<double>(&htt_hmixTYP);
    if (1 < NavierStokesBase::verbose) {
      this_00 = (Print *)amrex::OutStream();
      amrex::Print::Print(this_00,(ostream *)in_stack_fffffffffffff8a8);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff880,(char (*) [45])in_stack_fffffffffffff878);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff880,(double *)in_stack_fffffffffffff878);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878)
      ;
      amrex::Print::~Print(in_stack_fffffffffffff8f0);
    }
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffff890);
  }
  return;
}

Assistant:

void
PeleLM::set_htt_hmixTYP ()
{
   const int finest_level = parent->finestLevel();

   // set typical value for hmix, needed for TfromHY solves if not provided explicitly
   if (typical_values[RhoH]==typical_RhoH_value_default)
   {
      htt_hmixTYP = 0;
      std::vector< std::pair<int,Box> > isects;
      for (int lvl = 0; lvl <= finest_level; lvl++)
      {
         AmrLevel&       ht = getLevel(lvl);
         const MultiFab& S  = ht.get_new_data(State_Type);
         const BoxArray& ba = ht.boxArray();
         const DistributionMapping& dm = ht.DistributionMap();
         MultiFab hmix(ba,dm,1,0,MFInfo(),Factory());
         MultiFab::Copy(hmix,S,RhoH,0,1,0);
         MultiFab::Divide(hmix,S,Density,0,1,0);
         if (lvl != finest_level)
         {
            AmrLevel& htf = getLevel(lvl+1);
            BoxArray  baf = htf.boxArray();
            baf.coarsen(parent->refRatio(lvl));
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(hmix,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               auto const& h_mix = hmix.array(mfi);
               baf.intersections(ba[mfi.index()],isects);
               for (long unsigned int is = 0; is < isects.size(); is++) {
                  amrex::ParallelFor(isects[is].second, [h_mix]
                  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                  {
                     h_mix(i,j,k) = 0.0;
                  });
               }
            }
         }
         htt_hmixTYP = std::max(htt_hmixTYP,hmix.norm0(0));
      }
      ParallelDescriptor::ReduceRealMax(htt_hmixTYP);
      if (verbose > 1)
      amrex::Print() << "     setting htt_hmixTYP(via domain scan) = " << htt_hmixTYP << '\n';
   }
   else
   {
      htt_hmixTYP = typical_values[RhoH];
      if (verbose > 1)
         amrex::Print() << "     setting htt_hmixTYP(from user input) = " << htt_hmixTYP << '\n';
   }
}